

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shanten.cpp
# Opt level: O1

bool mahjong::enum_discard_tile_1
               (hand_tiles_t *hand_tiles,tile_t discard_tile,uint8_t form_flag,void *context,
               enum_callback_t enum_callback)

{
  tile_t *standing_tiles;
  long standing_cnt;
  char cVar1;
  undefined7 in_register_00000011;
  undefined8 uVar2;
  enum_result_t result;
  tile_t local_80 [4];
  int local_7c;
  bool local_78 [72];
  
  uVar2 = CONCAT71(in_register_00000011,form_flag);
  local_80[1] = 1;
  standing_tiles = hand_tiles->standing_tiles;
  local_80[0] = discard_tile;
  local_7c = basic_form_shanten(standing_tiles,hand_tiles->tile_count,&local_78);
  if ((local_7c == 0) && (local_78[discard_tile] == true)) {
    local_7c = -1;
  }
  cVar1 = (*(code *)context)(uVar2,local_80);
  if (cVar1 == '\0') {
    return false;
  }
  if (hand_tiles->tile_count == 0xd) {
    local_80[1] = 2;
    local_7c = seven_pairs_shanten(standing_tiles,0xd,&local_78);
    if ((local_7c == 0) && (local_78[discard_tile] == true)) {
      local_7c = -1;
    }
    cVar1 = (*(code *)context)(uVar2,local_80);
    if (cVar1 == '\0') {
      return false;
    }
    local_80[1] = 4;
    local_7c = thirteen_orphans_shanten(standing_tiles,hand_tiles->tile_count,&local_78);
    if ((local_7c == 0) && (local_78[discard_tile] == true)) {
      local_7c = -1;
    }
    cVar1 = (*(code *)context)(uVar2,local_80);
    if (cVar1 == '\0') {
      return false;
    }
    local_80[1] = 8;
    local_7c = honors_and_knitted_tiles_shanten(standing_tiles,hand_tiles->tile_count,&local_78);
    if ((local_7c == 0) && (local_78[discard_tile] == true)) {
      local_7c = -1;
    }
    cVar1 = (*(code *)context)(uVar2,local_80);
    if (cVar1 == '\0') {
      return false;
    }
  }
  standing_cnt = hand_tiles->tile_count;
  if ((standing_cnt == 0xd) || (standing_cnt == 10)) {
    local_80[1] = 0x10;
    local_7c = knitted_straight_shanten(standing_tiles,standing_cnt,&local_78);
    if ((local_7c == 0) && (local_78[discard_tile] == true)) {
      local_7c = -1;
    }
    cVar1 = (*(code *)context)(uVar2,local_80);
    if (cVar1 == '\0') {
      return false;
    }
  }
  return true;
}

Assistant:

static bool enum_discard_tile_1(const hand_tiles_t *hand_tiles, tile_t discard_tile, uint8_t form_flag,
    void *context, enum_callback_t enum_callback) {
    enum_result_t result;
    result.discard_tile = discard_tile;
    result.form_flag = FORM_FLAG_BASIC_FORM;
    result.shanten = basic_form_shanten(hand_tiles->standing_tiles, hand_tiles->tile_count, &result.useful_table);
    if (result.shanten == 0 && result.useful_table[discard_tile]) {  // 0上听，并且打出的牌是有效牌，则修正为和了
        result.shanten = -1;
    }
    if (!enum_callback(context, &result)) {
        return false;
    }

    // 立牌有13张时，才需要计算特殊和型
    if (hand_tiles->tile_count == 13) {
        if (form_flag | FORM_FLAG_SEVEN_PAIRS) {
            result.form_flag = FORM_FLAG_SEVEN_PAIRS;
            result.shanten = seven_pairs_shanten(hand_tiles->standing_tiles, hand_tiles->tile_count, &result.useful_table);
            if (result.shanten == 0 && result.useful_table[discard_tile]) {  // 0上听，并且打出的牌是有效牌，则修正为和了
                result.shanten = -1;
            }
            if (!enum_callback(context, &result)) {
                return false;
            }
        }

        if (form_flag | FORM_FLAG_THIRTEEN_ORPHANS) {
            result.form_flag = FORM_FLAG_THIRTEEN_ORPHANS;
            result.shanten = thirteen_orphans_shanten(hand_tiles->standing_tiles, hand_tiles->tile_count, &result.useful_table);
            if (result.shanten == 0 && result.useful_table[discard_tile]) {  // 0上听，并且打出的牌是有效牌，则修正为和了
                result.shanten = -1;
            }
            if (!enum_callback(context, &result)) {
                return false;
            }
        }

        if (form_flag | FORM_FLAG_HONORS_AND_KNITTED_TILES) {
            result.form_flag = FORM_FLAG_HONORS_AND_KNITTED_TILES;
            result.shanten = honors_and_knitted_tiles_shanten(hand_tiles->standing_tiles, hand_tiles->tile_count, &result.useful_table);
            if (result.shanten == 0 && result.useful_table[discard_tile]) {  // 0上听，并且打出的牌是有效牌，则修正为和了
                result.shanten = -1;
            }
            if (!enum_callback(context, &result)) {
                return false;
            }
        }
    }

    // 立牌有13张或者10张时，才需要计算组合龙
    if (hand_tiles->tile_count == 13 || hand_tiles->tile_count == 10) {
        if (form_flag | FORM_FLAG_KNITTED_STRAIGHT) {
            result.form_flag = FORM_FLAG_KNITTED_STRAIGHT;
            result.shanten = knitted_straight_shanten(hand_tiles->standing_tiles, hand_tiles->tile_count, &result.useful_table);
            if (result.shanten == 0 && result.useful_table[discard_tile]) {  // 0上听，并且打出的牌是有效牌，则修正为和了
                result.shanten = -1;
            }
            if (!enum_callback(context, &result)) {
                return false;
            }
        }
    }

    return true;
}